

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerProfiledStFld
          (Lowerer *this,JitProfilingInstr *stFldInstr,PropertyOperationFlags flags)

{
  LowererMD *this_00;
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *opndArg;
  Opnd *pOVar6;
  SymOpnd *pSVar7;
  PropertySymOpnd *pPVar8;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *newSrc;
  PropertyOperationFlags fnHelper;
  
  if (stFldInstr->profileId != 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b4b,"(stFldInstr->profileId == Js::Constants::NoProfileId)",
                       "stFldInstr->profileId == Js::Constants::NoProfileId");
    if (!bVar4) goto LAB_00569cb4;
    *puVar5 = 0;
  }
  pIVar2 = (stFldInstr->super_Instr).m_prev;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,&opndArg->super_Opnd);
  OVar1 = (stFldInstr->super_Instr).m_opcode;
  if ((OVar1 == StSuperFldStrict) || (OVar1 == StSuperFld)) {
    pOVar6 = IR::Instr::UnlinkSrc2(&stFldInstr->super_Instr);
    LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,pOVar6);
  }
  pOVar6 = IR::Instr::UnlinkSrc1(&stFldInstr->super_Instr);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,pOVar6);
  pOVar6 = IR::Instr::UnlinkDst(&stFldInstr->super_Instr);
  bVar4 = IR::Opnd::IsSymOpnd(pOVar6);
  if (bVar4) {
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
    if (pSVar7->m_sym->m_kind == SymKindProperty) goto LAB_00569c04;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1b72,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as dst of field store");
  if (!bVar4) {
LAB_00569cb4:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar5 = 0;
LAB_00569c04:
  pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar6);
  opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,&opndArg_00->super_Opnd);
  LoadPropertySymAsArgument(this,&stFldInstr->super_Instr,pOVar6);
  OVar1 = (stFldInstr->super_Instr).m_opcode;
  fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
             PropertyOperation_PreInitSpecialValue|PropertyOperation_Force;
  if ((OVar1 != InitFld) && (OVar1 != InitRootFld)) {
    if (OVar1 == StSuperFldStrict) {
      fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                 PropertyOperation_PreInitSpecialValue|PropertyOperation_ThrowIfNotExtensible;
    }
    else if (OVar1 == StSuperFld) {
      fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                 PropertyOperation_PreInitSpecialValue|PropertyOperation_StrictModeRoot;
    }
    else if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
      fnHelper = (flags & PropertyOperation_StrictMode) * 3 +
                 (PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                  PropertyOperation_PreInitSpecialValue|PropertyOperation_Root);
    }
    else {
      fnHelper = flags & PropertyOperation_StrictMode |
                 (PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                  PropertyOperation_PreInitSpecialValue|PropertyOperation_ThrowIfNotExtensible|
                 PropertyOperation_Root);
    }
  }
  newSrc = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  IR::Instr::SetSrc1(&stFldInstr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(this_00,&stFldInstr->super_Instr,0);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledStFld(IR::JitProfilingInstr *stFldInstr, Js::PropertyOperationFlags flags)
{
    Assert(stFldInstr->profileId == Js::Constants::NoProfileId);

    IR::Instr *const instrPrev = stFldInstr->m_prev;

    /*
        void ProfilingHelpers::ProfiledInitFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStSuperFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer,
            const Var thisInstance)
    {
    */

    m_lowererMD.LoadHelperArgument(stFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));

    if (stFldInstr->m_opcode == Js::OpCode::StSuperFld || stFldInstr->m_opcode == Js::OpCode::StSuperFldStrict)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc2());
    }

    m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc1());

    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");
    m_lowererMD.LoadHelperArgument(
        stFldInstr,
        IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

    LoadPropertySymAsArgument(stFldInstr, dst);

    IR::JnHelperMethod helper;
    switch (stFldInstr->m_opcode)
    {
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
        helper = IR::HelperProfiledInitFld;
        break;

    case Js::OpCode::StSuperFld:
        helper = IR::HelperProfiledStSuperFld;
        break;

    case Js::OpCode::StSuperFldStrict:
        helper = IR::HelperProfiledStSuperFld_Strict;
        break;

    default:
        helper =
            flags & Js::PropertyOperation_Root
                ? flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStRootFld_Strict : IR::HelperProfiledStRootFld
                : flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStFld_Strict : IR::HelperProfiledStFld;
        break;
    }
    stFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(stFldInstr, 0);

    return instrPrev;
}